

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O3

ObjectData *
deqp::gles3::Performance::anon_unknown_0::Utils::variableQuad
          (ObjectData *__return_storage_ptr__,float depth)

{
  _Alloc_hider _Var1;
  pointer pfVar2;
  pointer pcVar3;
  ObjectData *extraout_RAX;
  ObjectData *extraout_RAX_00;
  ObjectData *extraout_RAX_01;
  ObjectData *pOVar4;
  long lVar5;
  size_type __dnew;
  size_type __dnew_1;
  ProgramSources sources;
  value_type local_150;
  vector<float,_std::allocator<float>_> local_130;
  value_type local_118;
  ProgramSources local_f8;
  
  local_150._M_dataplus._M_p = (pointer)0x145;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  pcVar3 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_118,(ulong)&local_150);
  _Var1._M_p = local_150._M_dataplus._M_p;
  local_118.field_2._M_allocated_capacity = (size_type)local_150._M_dataplus._M_p;
  local_118._M_dataplus._M_p = pcVar3;
  memcpy(pcVar3,
         "#version 300 es\nin highp vec4 a_position;\nout mediump vec3 v_bcoords;\nvoid main()\n{\n\tv_bcoords = vec3(0, 0, 0);\n\tv_bcoords[int(a_position.w)] = 1.0;\n\tvec3 noise = vec3(sin(float(gl_InstanceID)*1.05), sin(float(gl_InstanceID)*1.23), sin(float(gl_InstanceID)*1.71));\n\tgl_Position = vec4(a_position.xyz + noise * 0.005, 1.0);\n}\n"
         ,0x145);
  local_118._M_string_length = (size_type)_Var1._M_p;
  pcVar3[_Var1._M_p] = '\0';
  local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xff;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  pcVar3 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_150,(ulong)&local_130);
  pfVar2 = local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_150.field_2._M_allocated_capacity =
       (size_type)
       local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_150._M_dataplus._M_p = pcVar3;
  memcpy(pcVar3,
         "#version 300 es\nin mediump vec3 v_bcoords;\nout mediump vec4 fragColor;\nvoid main()\n{\n\tmediump float d = gl_FragCoord.z;\n\tif (v_bcoords.x < 0.02 || v_bcoords.y < 0.02 || v_bcoords.z < 0.02)\n\t\tfragColor = vec4(1,d,d,1);\n\telse\n\t\tfragColor = vec4(d,0,0,1);\n}\n"
         ,0xff);
  local_150._M_string_length = (size_type)pfVar2;
  pcVar3[(long)pfVar2] = '\0';
  memset(&local_f8,0,0xac);
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_f8._193_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_f8.sources,&local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_f8.sources + 1,&local_150);
  getFullscreenQuad(&local_130,0.8);
  ObjectData::ObjectData(__return_storage_ptr__,&local_f8,&local_130);
  if (local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_130.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_f8.attribLocationBindings);
  lVar5 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_f8.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar5));
    lVar5 = lVar5 + -0x18;
  } while (lVar5 != -0x18);
  pOVar4 = extraout_RAX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    pOVar4 = extraout_RAX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,(ulong)(local_118.field_2._M_allocated_capacity + 1))
    ;
    pOVar4 = extraout_RAX_01;
  }
  return pOVar4;
}

Assistant:

inline ObjectData variableQuad (float depth)
	{
		return ObjectData(glu::makeVtxFragSources(getInstanceNoiseVertexShader(), getDepthAsRedFragmentShader()), getFullscreenQuad(depth));
	}